

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O3

SBuf * lj_strfmt_putfchar(SBuf *sb,SFormat sf,int32_t c)

{
  uint uVar1;
  MSize sz;
  uint uVar2;
  char *__s;
  
  uVar2 = sf >> 0x10 & 0xff;
  sz = uVar2 + (uVar2 == 0);
  uVar1 = (sb->p).ptr32;
  __s = (char *)(ulong)uVar1;
  if ((sb->e).ptr32 - uVar1 < sz) {
    __s = lj_buf_more2(sb,sz);
  }
  if ((sf >> 8 & 1) != 0) {
    *__s = (char)c;
    __s = __s + 1;
  }
  if (1 < uVar2) {
    memset(__s,0x20,(ulong)(uVar2 - 1));
    __s = __s + ((ulong)uVar2 - 1);
  }
  if ((sf >> 8 & 1) == 0) {
    *__s = (char)c;
    __s = __s + 1;
  }
  (sb->p).ptr32 = (uint32_t)__s;
  return sb;
}

Assistant:

SBuf *lj_strfmt_putfchar(SBuf *sb, SFormat sf, int32_t c)
{
  MSize width = STRFMT_WIDTH(sf);
  char *p = lj_buf_more(sb, width > 1 ? width : 1);
  if ((sf & STRFMT_F_LEFT)) *p++ = (char)c;
  while (width-- > 1) *p++ = ' ';
  if (!(sf & STRFMT_F_LEFT)) *p++ = (char)c;
  setsbufP(sb, p);
  return sb;
}